

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

pel xGetLumaBorderPixel(int uiIdx,int bAbovePixel,int uiCWidth,int uiCHeight,int bAboveAvail,
                       int bLeftAvail,pel *luma)

{
  pel pVar1;
  int iVar2;
  
  if (bAbovePixel == 0) {
    pVar1 = 0xff;
    if (uiIdx < uiCHeight * 2 && bLeftAvail != 0) {
      pVar1 = (pel)((uint)luma[-1 - (long)uiIdx] + (uint)luma[(long)~uiIdx + -1] + 1 >> 1);
    }
  }
  else {
    pVar1 = 0xff;
    if ((bAboveAvail != 0) && (uiIdx < uiCWidth * 2)) {
      if (bLeftAvail == 0 && uiIdx == 0) {
        iVar2 = (uint)luma[1] + (uint)luma[1] * 2 + (uint)luma[2];
      }
      else {
        iVar2 = (uint)luma[(long)uiIdx + 2] + (uint)luma[uiIdx] + (uint)luma[(long)uiIdx + 1] * 2;
      }
      return (pel)(iVar2 + 2U >> 2);
    }
  }
  return pVar1;
}

Assistant:

pel xGetLumaBorderPixel(int uiIdx, int bAbovePixel, int uiCWidth, int uiCHeight, int bAboveAvail, int bLeftAvail, pel *luma)
{
    pel *pSrc = NULL;
    pel dstPoint = -1;

    if (bAbovePixel) {
        if (bAboveAvail) {
            pSrc = luma + 1;
            int i = uiIdx;
            if (i < (uiCWidth << 1)) {
                if (i == 0 && !bLeftAvail) {
                    dstPoint = (3 * pSrc[i] + pSrc[i + 1] + 2) >> 2;
                } else {
                    dstPoint = (2 * pSrc[i] + pSrc[i - 1] + pSrc[i + 1] + 2) >> 2;
                }
            }
        }
    } else {
        if (bLeftAvail) {
            pSrc = luma - 1;
            int j = uiIdx;
            if (j < (uiCHeight << 1)) {
                dstPoint = (pSrc[-j] + pSrc[-j - 1] + 1) >> 1;
            }
        }
    }
    uavs3d_assert(dstPoint >= 0);
    return dstPoint;
}